

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

Vertex __thiscall embree::OBJLoader::getUInt3(OBJLoader *this,char **token)

{
  Vertex VVar1;
  int iVar2;
  size_t sVar3;
  OBJLoader *in_RSI;
  OBJLoader *in_RDI;
  Vertex v;
  int in_stack_ffffffffffffffdc;
  Vertex local_c;
  
  Vertex::Vertex(&local_c,0xffffffff);
  iVar2 = atoi((char *)(in_RSI->group).ptr);
  local_c.v = fix_v(in_RDI,iVar2);
  sVar3 = strcspn((char *)(in_RSI->group).ptr,"/ \t\r");
  (in_RSI->group).ptr =
       (GroupNode *)
       ((long)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount + sVar3);
  if (*(char *)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount == '/') {
    (in_RSI->group).ptr =
         (GroupNode *)((long)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount + 1)
    ;
    if (*(char *)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount == '/') {
      (in_RSI->group).ptr =
           (GroupNode *)
           ((long)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount + 1);
      iVar2 = atoi((char *)(in_RSI->group).ptr);
      local_c.vn = fix_vn(in_RDI,iVar2);
      sVar3 = strcspn((char *)(in_RSI->group).ptr," \t\r");
      (in_RSI->group).ptr =
           (GroupNode *)
           ((long)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount + sVar3);
    }
    else {
      atoi((char *)(in_RSI->group).ptr);
      local_c.vt = fix_vt(in_RSI,in_stack_ffffffffffffffdc);
      sVar3 = strcspn((char *)(in_RSI->group).ptr,"/ \t\r");
      (in_RSI->group).ptr =
           (GroupNode *)
           ((long)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount + sVar3);
      if (*(char *)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount == '/') {
        (in_RSI->group).ptr =
             (GroupNode *)
             ((long)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount + 1);
        iVar2 = atoi((char *)(in_RSI->group).ptr);
        local_c.vn = fix_vn(in_RDI,iVar2);
        sVar3 = strcspn((char *)(in_RSI->group).ptr," \t\r");
        (in_RSI->group).ptr =
             (GroupNode *)
             ((long)&(((in_RSI->group).ptr)->super_Node).super_RefCount._vptr_RefCount + sVar3);
      }
    }
  }
  VVar1.vt = local_c.vt;
  VVar1.v = local_c.v;
  VVar1.vn = local_c.vn;
  return VVar1;
}

Assistant:

Vertex OBJLoader::getUInt3(const char*& token)
  {
    Vertex v(-1);
    v.v = fix_v(atoi(token));
    token += strcspn(token, "/ \t\r");
    if (token[0] != '/') return(v);
    token++;

    // it is i//n
    if (token[0] == '/') {
      token++;
      v.vn = fix_vn(atoi(token));
      token += strcspn(token, " \t\r");
      return(v);
    }

    // it is i/t/n or i/t
    v.vt = fix_vt(atoi(token));
    token += strcspn(token, "/ \t\r");
    if (token[0] != '/') return(v);
    token++;

    // it is i/t/n
    v.vn = fix_vn(atoi(token));
    token += strcspn(token, " \t\r");
    return(v);
  }